

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall duckdb_re2::Regexp::Destroy(Regexp *this)

{
  LogMessage *pLVar1;
  bool bVar2;
  ostream *poVar3;
  LogMessage *this_00;
  Regexp **ppRVar4;
  LogMessage *in_RDI;
  Regexp *sub;
  int i;
  Regexp **subs;
  Regexp *re;
  Regexp *stack;
  Regexp *in_stack_fffffffffffffe08;
  LogMessage *in_stack_fffffffffffffe10;
  LogMessage *pLVar5;
  int local_1b4;
  Regexp *in_stack_fffffffffffffe70;
  Regexp *in_stack_ffffffffffffffb0;
  LogMessage *local_10;
  
  bVar2 = QuickDestroy(in_stack_fffffffffffffe08);
  if (!bVar2) {
    *(undefined8 *)&in_RDI->field_0x10 = 0;
    local_10 = in_RDI;
    while (pLVar5 = local_10, local_10 != (LogMessage *)0x0) {
      pLVar1 = *(LogMessage **)&local_10->field_0x10;
      if (*(short *)&local_10->field_0x4 != 0) {
        LogMessage::LogMessage(in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08,0);
        poVar3 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffe68);
        this_00 = (LogMessage *)std::operator<<(poVar3,"Bad reference count ");
        std::ostream::operator<<(this_00,*(ushort *)&local_10->field_0x4);
        LogMessage::~LogMessage(this_00);
      }
      if (*(short *)&local_10->field_0x6 != 0) {
        ppRVar4 = Regexp::sub((Regexp *)local_10);
        local_10 = pLVar1;
        for (local_1b4 = 0; local_1b4 < (int)(uint)*(ushort *)&pLVar5->field_0x6;
            local_1b4 = local_1b4 + 1) {
          pLVar1 = (LogMessage *)ppRVar4[local_1b4];
          if (pLVar1 != (LogMessage *)0x0) {
            if (*(uint16_t *)&pLVar1->field_0x4 == 0xffff) {
              Decref(in_stack_fffffffffffffe70);
            }
            else {
              *(uint16_t *)&pLVar1->field_0x4 = *(uint16_t *)&pLVar1->field_0x4 - 1;
            }
            if ((*(uint16_t *)&pLVar1->field_0x4 == 0) &&
               (bVar2 = QuickDestroy(in_stack_fffffffffffffe08), !bVar2)) {
              *(LogMessage **)&pLVar1->field_0x10 = local_10;
              local_10 = pLVar1;
            }
          }
        }
        if ((1 < *(ushort *)&pLVar5->field_0x6) && (ppRVar4 != (Regexp **)0x0)) {
          operator_delete__(ppRVar4);
        }
        *(undefined2 *)&pLVar5->field_0x6 = 0;
        pLVar1 = local_10;
      }
      local_10 = pLVar1;
      in_stack_fffffffffffffe10 = pLVar5;
      if (pLVar5 != (LogMessage *)0x0) {
        ~Regexp(in_stack_ffffffffffffffb0);
        operator_delete(pLVar5);
        in_stack_fffffffffffffe10 = pLVar5;
      }
    }
  }
  return;
}

Assistant:

void Regexp::Destroy() {
  if (QuickDestroy())
    return;

  // Handle recursive Destroy with explicit stack
  // to avoid arbitrarily deep recursion on process stack [sigh].
  down_ = NULL;
  Regexp* stack = this;
  while (stack != NULL) {
    Regexp* re = stack;
    stack = re->down_;
    if (re->ref_ != 0)
      LOG(DFATAL) << "Bad reference count " << re->ref_;
    if (re->nsub_ > 0) {
      Regexp** subs = re->sub();
      for (int i = 0; i < re->nsub_; i++) {
        Regexp* sub = subs[i];
        if (sub == NULL)
          continue;
        if (sub->ref_ == kMaxRef)
          sub->Decref();
        else
          --sub->ref_;
        if (sub->ref_ == 0 && !sub->QuickDestroy()) {
          sub->down_ = stack;
          stack = sub;
        }
      }
      if (re->nsub_ > 1)
        delete[] subs;
      re->nsub_ = 0;
    }
    delete re;
  }
}